

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall
bssl::InplaceVector<NoSelfMove,_8UL>::Shrink(InplaceVector<NoSelfMove,_8UL> *this,size_t new_size)

{
  NoSelfMove *pNVar1;
  size_t new_size_local;
  InplaceVector<NoSelfMove,_8UL> *this_local;
  
  if (this->size_ < new_size) {
    abort();
  }
  pNVar1 = data(this);
  std::
  destroy_n<bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::NoSelfMove*,unsigned_long>
            (pNVar1 + new_size,this->size_ - new_size);
  this->size_ = (PackedSize<8UL>)new_size;
  return;
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }